

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-alloc.c
# Opt level: O3

void ggml_gallocr_allocate_node(ggml_gallocr_t galloc,ggml_tensor *node,int buffer_id)

{
  uint uVar1;
  ggml_op gVar2;
  ggml_tensor *t;
  ggml_tensor *t_00;
  ggml_dyn_tallocr *pgVar3;
  ulong uVar4;
  size_t sVar5;
  hash_node *phVar6;
  hash_node *phVar7;
  long lVar8;
  hash_node *phVar9;
  size_t sVar10;
  free_block *pfVar11;
  ulong uVar12;
  uint uVar13;
  ulong uVar14;
  long lVar15;
  ulong uVar16;
  size_t *psVar17;
  ulong uVar18;
  ulong uVar19;
  
  if (buffer_id < 0) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]whisper/ggml/src/ggml-alloc.c"
               ,0x1df,"GGML_ASSERT(%s) failed","buffer_id >= 0");
  }
  phVar6 = ggml_gallocr_hash_get(galloc,node);
  if (node->data != (void *)0x0) {
    return;
  }
  phVar7 = ggml_gallocr_hash_get(galloc,node);
  if (phVar7->allocated != false) {
    return;
  }
  if (node->view_src != (ggml_tensor *)0x0) {
    return;
  }
  phVar6->allocated = true;
  gVar2 = node->op;
  if ((((ulong)gVar2 < 0x2f) && ((0x7e0041a007ecU >> ((ulong)gVar2 & 0x3f) & 1) != 0)) ||
     (gVar2 == GGML_OP_UNARY)) {
    lVar15 = 0;
    do {
      t = node->src[lVar15];
      if ((((t != (ggml_tensor *)0x0) &&
           (phVar7 = ggml_gallocr_hash_get(galloc,t), phVar7->allocated == true)) &&
          (((t->flags & 2) == 0 &&
           ((t->view_src == (ggml_tensor *)0x0 || ((t->view_src->flags & 2) == 0)))))) &&
         (node->type == t->type)) {
        lVar8 = 6;
        do {
          if ((node->ne[lVar8 + -6] != t->ne[lVar8 + -6]) ||
             (node->ne[lVar8 + -2] != t->ne[lVar8 + -2])) goto LAB_00124e8f;
          lVar8 = lVar8 + 1;
        } while (lVar8 != 10);
        phVar7 = ggml_gallocr_hash_get(galloc,t);
        if ((phVar7->n_children == 1) && (phVar7->n_views == 0)) {
          t_00 = t->view_src;
          if (t_00 == (ggml_tensor *)0x0) {
            phVar6->buffer_id = phVar7->buffer_id;
            phVar6->offset = phVar7->offset;
            phVar7->allocated = false;
            return;
          }
          phVar9 = ggml_gallocr_hash_get(galloc,t_00);
          if (((phVar9->n_views == 1) && (phVar9->n_children == 0)) && (t_00->data == t->data)) {
            phVar6->buffer_id = phVar7->buffer_id;
            phVar6->offset = phVar7->offset;
            phVar7->allocated = false;
            phVar9->allocated = false;
            return;
          }
        }
      }
LAB_00124e8f:
      lVar15 = lVar15 + 1;
    } while (lVar15 != 10);
  }
  pgVar3 = galloc->buf_tallocs[(uint)buffer_id];
  sVar10 = ggml_backend_buft_get_alloc_size(galloc->bufts[(uint)buffer_id],node);
  uVar12 = pgVar3->alignment;
  uVar16 = 0;
  uVar12 = (uVar12 - sVar10 % uVar12) % uVar12 + sVar10;
  uVar1 = pgVar3->n_free_blocks - 1;
  if (1 < pgVar3->n_free_blocks) {
    psVar17 = &pgVar3->free_blocks[0].size;
    uVar18 = 0xffffffffffffffff;
    uVar14 = 0xffffffff;
    uVar19 = 0;
    uVar16 = 0;
    do {
      uVar4 = *psVar17;
      if (uVar16 <= uVar4) {
        uVar16 = uVar4;
      }
      if (uVar4 <= uVar18 && uVar12 <= uVar4) {
        uVar14 = uVar19 & 0xffffffff;
        uVar18 = uVar4;
      }
      uVar13 = (uint)uVar14;
      uVar19 = uVar19 + 1;
      psVar17 = psVar17 + 2;
    } while (uVar1 != uVar19);
    if (uVar13 != 0xffffffff) {
      lVar15 = (long)(int)uVar13;
      goto LAB_00124f4e;
    }
  }
  lVar15 = (long)(int)uVar1;
  uVar18 = pgVar3->free_blocks[lVar15].size;
  uVar13 = uVar1;
  if (uVar18 < uVar12) {
    if (uVar18 < uVar16) {
      uVar18 = uVar16;
    }
    ggml_log_internal(GGML_LOG_LEVEL_ERROR,
                      "%s: not enough space in the buffer to allocate %zu bytes, largest block available %zu bytes\n"
                      ,"ggml_dyn_tallocr_alloc",uVar12,uVar18);
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]whisper/ggml/src/ggml-alloc.c"
               ,0xb6,"not enough space in the buffer");
  }
LAB_00124f4e:
  sVar10 = pgVar3->free_blocks[lVar15].offset;
  uVar16 = sVar10 + uVar12;
  pgVar3->free_blocks[lVar15].offset = uVar16;
  psVar17 = &pgVar3->free_blocks[lVar15].size;
  *psVar17 = *psVar17 - uVar12;
  if ((*psVar17 == 0) && (pgVar3->n_free_blocks = uVar1, (int)uVar13 < (int)uVar1)) {
    pfVar11 = pgVar3->free_blocks + lVar15 + 1;
    do {
      lVar15 = lVar15 + 1;
      sVar5 = pfVar11->size;
      ((ggml_dyn_tallocr *)(pfVar11 + -1))->alignment = pfVar11->offset;
      *(size_t *)&((ggml_dyn_tallocr *)(pfVar11 + -1))->n_free_blocks = sVar5;
      pfVar11 = pfVar11 + 1;
    } while (lVar15 < pgVar3->n_free_blocks);
  }
  if (uVar16 < pgVar3->max_size) {
    uVar16 = pgVar3->max_size;
  }
  pgVar3->max_size = uVar16;
  phVar6->buffer_id = buffer_id;
  phVar6->offset = sVar10;
  return;
}

Assistant:

static void ggml_gallocr_allocate_node(ggml_gallocr_t galloc, struct ggml_tensor * node, int buffer_id) {
    GGML_ASSERT(buffer_id >= 0);
    struct hash_node * hn = ggml_gallocr_hash_get(galloc, node);

    if (!ggml_gallocr_is_allocated(galloc, node) && !ggml_is_view(node)) {
        hn->allocated = true;
        assert(hn->offset == 0);

        // try to reuse a parent's buffer (inplace)
        if (ggml_op_can_inplace(node->op)) {
            for (int i = 0; i < GGML_MAX_SRC; i++) {
                struct ggml_tensor * parent = node->src[i];
                if (parent == NULL) {
                    continue;
                }

                // if the node's data is external, then we cannot re-use it
                if (!ggml_gallocr_is_own(galloc, parent)) {
                    AT_PRINTF("not reusing parent %s for %s as %p is external\n", parent->name, node->name, parent->data);
                    continue;
                }

                // outputs cannot be reused
                if (parent->flags & GGML_TENSOR_FLAG_OUTPUT || (parent->view_src != NULL && parent->view_src->flags & GGML_TENSOR_FLAG_OUTPUT)) {
                    AT_PRINTF("not reusing parent %s for %s as it is an output\n", parent->name, node->name);
                    continue;
                }

                if (!ggml_are_same_layout(node, parent)) {
                    AT_PRINTF("not reusing parent %s for %s as layouts are different\n", parent->name, node->name);
                    continue;
                }

                struct hash_node * p_hn = ggml_gallocr_hash_get(galloc, parent);
                if (p_hn->n_children == 1 && p_hn->n_views == 0) {
                    if (ggml_is_view(parent)) {
                        struct ggml_tensor * view_src = parent->view_src;
                        struct hash_node * view_src_hn = ggml_gallocr_hash_get(galloc, view_src);
                        if (view_src_hn->n_views == 1 && view_src_hn->n_children == 0 && view_src->data == parent->data) {
                            AT_PRINTF("reusing view parent %s (%s) for %s\n", parent->name, view_src->name, node->name);
                            assert(view_src_hn->offset == p_hn->offset);
                            hn->buffer_id = p_hn->buffer_id;
                            hn->offset = p_hn->offset;
                            p_hn->allocated = false; // avoid freeing the parent
                            view_src_hn->allocated = false;
                            return;
                        }
                    } else {
                        AT_PRINTF("reusing parent %s for %s\n", parent->name, node->name);
                        hn->buffer_id = p_hn->buffer_id;
                        hn->offset = p_hn->offset;
                        p_hn->allocated = false; // avoid freeing the parent
                        return;
                    }
                }
            }
        }
        // allocate tensor from the buffer
        struct ggml_dyn_tallocr * alloc = galloc->buf_tallocs[buffer_id];
        ggml_backend_buffer_type_t buft = galloc->bufts[buffer_id];
        size_t size = ggml_backend_buft_get_alloc_size(buft, node);
        size_t offset = ggml_dyn_tallocr_alloc(alloc, size, node);
        hn->buffer_id = buffer_id;
        hn->offset = offset;
    }
}